

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabb.h
# Opt level: O3

bool __thiscall AABB::Hit(AABB *this,Ray *ray,double tmin,double tmax)

{
  ulong uVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double local_38 [4];
  double local_18 [3];
  
  uVar1 = 0;
  bVar3 = false;
  do {
    local_18[2] = (ray->a_).e[2];
    local_18[0] = (ray->a_).e[0];
    local_18[1] = (ray->a_).e[1];
    local_38[2] = (ray->b_).e[2];
    local_38[0] = (ray->b_).e[0];
    local_38[1] = (ray->b_).e[1];
    local_18[2] = (ray->a_).e[2];
    local_18[0] = (ray->a_).e[0];
    local_18[1] = (ray->a_).e[1];
    auVar7._0_8_ = (this->max_).e[uVar1] - local_18[uVar1];
    auVar7._8_8_ = (this->min_).e[uVar1] - local_18[uVar1];
    local_38[2] = (ray->b_).e[2];
    local_38[0] = (ray->b_).e[0];
    local_38[1] = (ray->b_).e[1];
    auVar10._8_8_ = local_38[uVar1];
    auVar10._0_8_ = local_38[uVar1];
    auVar7 = divpd(auVar7,auVar10);
    dVar6 = auVar7._0_8_;
    dVar8 = auVar7._8_8_;
    uVar2 = (uint)(dVar6 < dVar8);
    auVar11._0_8_ = CONCAT44((int)(uVar2 << 0x1f) >> 0x1f,(int)(uVar2 << 0x1f) >> 0x1f);
    auVar11._8_4_ = (int)(uVar2 << 0x1f) >> 0x1f;
    auVar11._12_4_ = (int)(uVar2 << 0x1f) >> 0x1f;
    dVar9 = (double)(~auVar11._0_8_ & (ulong)dVar8 | (ulong)dVar6 & auVar11._0_8_);
    dVar6 = (double)(~auVar11._8_8_ & (ulong)dVar6 | (ulong)dVar8 & auVar11._8_8_);
    uVar4 = -(ulong)(dVar9 < tmin);
    uVar5 = -(ulong)(tmax < dVar6);
    tmin = (double)(~uVar4 & (ulong)dVar9 | (ulong)tmin & uVar4);
    tmax = (double)(~uVar5 & (ulong)dVar6 | (ulong)tmax & uVar5);
    if (tmax < tmin) {
      return bVar3;
    }
    bVar3 = 1 < uVar1;
    uVar1 = uVar1 + 1;
  } while (uVar1 != 3);
  return bVar3;
}

Assistant:

bool Hit(const Ray& ray, double tmin, double tmax) const {
    for (int i = 0; i < 3; i++) {
      double t0 = (min_[i] - ray.origin()[i]) / ray.direction()[i];
      double t1 = (max_[i] - ray.origin()[i]) / ray.direction()[i];
      if (t0 > t1) std::swap(t0, t1);
      tmin = t0 < tmin ? tmin : t0;
      tmax = t1 > tmax ? tmax : t1;
      if (tmax < tmin) return false;
    }
    return true;
  }